

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_DRBG.c
# Opt level: O1

_Bool instantiate_sha1(EverCrypt_DRBG_state_s *st,uint8_t *personalization_string,
                      uint32_t personalization_string_len)

{
  long lVar1;
  undefined8 uVar2;
  uint8_t *puVar3;
  uint8_t *dst;
  ulong __n;
  undefined1 uVar4;
  _Bool _Var5;
  uint32_t uVar6;
  uint32_t uVar7;
  undefined7 extraout_var;
  uint8_t *puVar9;
  uint8_t *puVar10;
  ulong uVar11;
  uint8_t *__s;
  uint8_t *dst_00;
  uint8_t *puVar12;
  uint len;
  int iVar13;
  uint8_t auStack_90 [8];
  uint8_t *local_88;
  uint32_t *local_80;
  undefined8 local_78;
  ulong local_70;
  uint8_t *local_68;
  uint8_t *local_60;
  uint8_t *local_58;
  uint8_t *local_50;
  uint local_44;
  ulong local_40;
  ulong local_38;
  ulong uVar8;
  
  if (Hacl_HMAC_DRBG_max_personalization_string_length < personalization_string_len) {
    uVar4 = 0;
  }
  else {
    builtin_memcpy(auStack_90,"]X\x17",4);
    auStack_90[4] = '\0';
    auStack_90[5] = '\0';
    auStack_90[6] = '\0';
    auStack_90[7] = '\0';
    local_68 = personalization_string;
    uVar6 = Hacl_HMAC_DRBG_min_length('\x04');
    builtin_memcpy(auStack_90,"iX\x17",4);
    auStack_90[4] = '\0';
    auStack_90[5] = '\0';
    auStack_90[6] = '\0';
    auStack_90[7] = '\0';
    uVar7 = Hacl_HMAC_DRBG_min_length('\x04');
    local_38 = (ulong)(uVar7 >> 1);
    len = (uVar7 >> 1) + uVar6;
    uVar8 = (ulong)len;
    lVar1 = -(uVar8 + 0xf & 0xfffffffffffffff0);
    puVar12 = (uint8_t *)((long)&local_88 + lVar1);
    puVar9 = auStack_90 + lVar1;
    local_70 = (ulong)uVar6;
    puVar9[0] = 0x98;
    puVar9[1] = 'X';
    puVar9[2] = '\x17';
    puVar9[3] = '\0';
    puVar9[4] = '\0';
    puVar9[5] = '\0';
    puVar9[6] = '\0';
    puVar9[7] = '\0';
    memset(puVar12,0,uVar8);
    puVar10 = auStack_90 + lVar1;
    local_40 = uVar8;
    puVar10[0] = 0xa7;
    puVar10[1] = 'X';
    puVar10[2] = '\x17';
    puVar10[3] = '\0';
    puVar10[4] = '\0';
    puVar10[5] = '\0';
    puVar10[6] = '\0';
    puVar10[7] = '\0';
    _Var5 = Lib_RandomBuffer_System_randombytes(puVar12,len);
    uVar8 = CONCAT71(extraout_var,_Var5);
    if (_Var5) {
      local_44 = (uint)uVar8;
      local_60 = (st->field_1).case_SHA1_s.k;
      local_58 = (st->field_1).case_SHA1_s.v;
      local_80 = (st->field_1).case_SHA1_s.reseed_counter;
      uVar8 = (ulong)((int)local_40 + personalization_string_len);
      iVar13 = (int)local_70;
      uVar11 = local_70 & 0xffffffff;
      local_88 = puVar12 + uVar11;
      local_50 = (uint8_t *)CONCAT71(local_50._1_7_,st->tag);
      lVar1 = -(uVar8 + 0xf & 0xfffffffffffffff0);
      __s = puVar12 + lVar1;
      local_40 = uVar8;
      local_78 = &local_88;
      builtin_memcpy(puVar12 + lVar1 + -8,"\nY\x17",4);
      __s[-4] = '\0';
      __s[-3] = '\0';
      __s[-2] = '\0';
      __s[-1] = '\0';
      memset(__s,0,uVar8);
      builtin_memcpy(puVar12 + lVar1 + -8,"\x18Y\x17",4);
      __s[-4] = '\0';
      __s[-3] = '\0';
      __s[-2] = '\0';
      __s[-1] = '\0';
      memcpy(__s,puVar12,uVar11);
      puVar3 = local_88;
      uVar8 = local_38 & 0xffffffff;
      builtin_memcpy(puVar12 + lVar1 + -8,"-Y\x17",4);
      __s[-4] = '\0';
      __s[-3] = '\0';
      __s[-2] = '\0';
      __s[-1] = '\0';
      memcpy(__s + uVar11,puVar3,uVar8);
      puVar3 = local_68;
      builtin_memcpy(puVar12 + lVar1 + -8,"?Y\x17",4);
      __s[-4] = '\0';
      __s[-3] = '\0';
      __s[-2] = '\0';
      __s[-1] = '\0';
      memcpy(__s + uVar11 + uVar8,puVar3,(ulong)personalization_string_len);
      puVar3 = local_58;
      if ((char)local_50 != '\0') {
        __s[-8] = '@';
        __s[-7] = '[';
        __s[-6] = '\x17';
        __s[-5] = '\0';
        __s[-4] = '\0';
        __s[-3] = '\0';
        __s[-2] = '\0';
        __s[-1] = '\0';
        printf("KaRaMeL abort at %s:%d\n%s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_DRBG.c"
               ,0x118,"unreachable (pattern matches are exhaustive in F*)");
        *(code **)(__s + -8) = instantiate_sha2_256;
        exit(0xff);
      }
      local_60[0] = '\0';
      local_60[1] = '\0';
      local_60[2] = '\0';
      local_60[3] = '\0';
      local_60[4] = '\0';
      local_60[5] = '\0';
      local_60[6] = '\0';
      local_60[7] = '\0';
      local_60[8] = '\0';
      local_60[9] = '\0';
      local_60[10] = '\0';
      local_60[0xb] = '\0';
      local_60[0xc] = '\0';
      local_60[0xd] = '\0';
      local_60[0xe] = '\0';
      local_60[0xf] = '\0';
      local_60[0x10] = '\0';
      local_60[0x11] = '\0';
      local_60[0x12] = '\0';
      local_60[0x13] = '\0';
      builtin_memcpy(local_58,
                     "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                     ,0x14);
      *local_80 = 1;
      uVar8 = (ulong)((int)local_38 + personalization_string_len + iVar13 + 0x15);
      uVar11 = uVar8 + 0xf & 0xfffffffffffffff0;
      dst_00 = __s + -uVar11;
      local_38 = uVar8;
      dst_00[-8] = 0xa9;
      dst_00[-7] = 'Y';
      dst_00[-6] = '\x17';
      dst_00[-5] = '\0';
      dst_00[-4] = '\0';
      dst_00[-3] = '\0';
      dst_00[-2] = '\0';
      dst_00[-1] = '\0';
      memset(dst_00,0,uVar8);
      *(undefined4 *)(__s + -uVar11 + 0x10) = *(undefined4 *)(puVar3 + 0x10);
      uVar2 = *(undefined8 *)(puVar3 + 8);
      *(undefined8 *)dst_00 = *(undefined8 *)puVar3;
      *(undefined8 *)(dst_00 + 8) = uVar2;
      uVar8 = local_40;
      if (local_40 == 0) {
        dst_00[0x14] = '\0';
        uVar8 = local_38;
        puVar12 = local_60;
        dst_00[-8] = 0xdc;
        dst_00[-7] = 'Z';
        dst_00[-6] = '\x17';
        dst_00[-5] = '\0';
        dst_00[-4] = '\0';
        dst_00[-3] = '\0';
        dst_00[-2] = '\0';
        dst_00[-1] = '\0';
        EverCrypt_HMAC_compute_sha1(dst_00,puVar12,0x14,dst_00,(uint32_t)uVar8);
        puVar3 = local_58;
        dst_00[-8] = 0xf6;
        dst_00[-7] = 'Z';
        dst_00[-6] = '\x17';
        dst_00[-5] = '\0';
        dst_00[-4] = '\0';
        dst_00[-3] = '\0';
        dst_00[-2] = '\0';
        dst_00[-1] = '\0';
        EverCrypt_HMAC_compute_sha1(puVar3,dst_00,0x14,puVar3,0x14);
        *(undefined4 *)(puVar12 + 0x10) = *(undefined4 *)(dst_00 + 0x10);
        uVar2 = *(undefined8 *)(dst_00 + 8);
        *(undefined8 *)puVar12 = *(undefined8 *)dst_00;
        *(undefined8 *)(puVar12 + 8) = uVar2;
      }
      else {
        local_70 = -uVar11;
        dst_00[-8] = 0xdd;
        dst_00[-7] = 'Y';
        dst_00[-6] = '\x17';
        dst_00[-5] = '\0';
        dst_00[-4] = '\0';
        dst_00[-3] = '\0';
        dst_00[-2] = '\0';
        dst_00[-1] = '\0';
        memcpy(dst_00 + 0x15,__s,uVar8);
        dst_00[0x14] = '\0';
        uVar8 = local_38;
        puVar3 = local_60;
        dst_00[-8] = 0xfd;
        dst_00[-7] = 'Y';
        dst_00[-6] = '\x17';
        dst_00[-5] = '\0';
        dst_00[-4] = '\0';
        dst_00[-3] = '\0';
        dst_00[-2] = '\0';
        dst_00[-1] = '\0';
        EverCrypt_HMAC_compute_sha1(dst_00,puVar3,0x14,dst_00,(uint32_t)uVar8);
        dst = local_58;
        builtin_memcpy(puVar12 + -uVar11 + lVar1 + -8,"\x1aZ\x17",4);
        dst_00[-4] = '\0';
        dst_00[-3] = '\0';
        dst_00[-2] = '\0';
        dst_00[-1] = '\0';
        EverCrypt_HMAC_compute_sha1(dst,dst_00,0x14,dst,0x14);
        __n = local_38;
        local_68 = dst_00;
        *(undefined4 *)(puVar3 + 0x10) = *(undefined4 *)(dst_00 + 0x10);
        uVar2 = *(undefined8 *)(dst_00 + 8);
        *(undefined8 *)puVar3 = *(undefined8 *)dst_00;
        *(undefined8 *)(puVar3 + 8) = uVar2;
        puVar12 = dst_00 + -uVar11;
        local_50 = dst_00;
        puVar12[-8] = 'L';
        puVar12[-7] = 'Z';
        puVar12[-6] = '\x17';
        puVar12[-5] = '\0';
        puVar12[-4] = '\0';
        puVar12[-3] = '\0';
        puVar12[-2] = '\0';
        puVar12[-1] = '\0';
        memset(puVar12,0,__n);
        uVar2 = *(undefined8 *)(dst + 8);
        *(undefined8 *)puVar12 = *(undefined8 *)dst;
        *(undefined8 *)(puVar12 + 8) = uVar2;
        *(undefined4 *)(puVar12 + 0x10) = *(undefined4 *)(dst + 0x10);
        uVar8 = local_40;
        puVar12[-8] = 'j';
        puVar12[-7] = 'Z';
        puVar12[-6] = '\x17';
        puVar12[-5] = '\0';
        puVar12[-4] = '\0';
        puVar12[-3] = '\0';
        puVar12[-2] = '\0';
        puVar12[-1] = '\0';
        memcpy(puVar12 + 0x15,__s,uVar8);
        puVar12[0x14] = '\x01';
        puVar12[-8] = 0x85;
        puVar12[-7] = 'Z';
        puVar12[-6] = '\x17';
        puVar12[-5] = '\0';
        puVar12[-4] = '\0';
        puVar12[-3] = '\0';
        puVar12[-2] = '\0';
        puVar12[-1] = '\0';
        EverCrypt_HMAC_compute_sha1(puVar12,puVar3,0x14,puVar12,(uint32_t)__n);
        puVar12[-8] = 0x9e;
        puVar12[-7] = 'Z';
        puVar12[-6] = '\x17';
        puVar12[-5] = '\0';
        puVar12[-4] = '\0';
        puVar12[-3] = '\0';
        puVar12[-2] = '\0';
        puVar12[-1] = '\0';
        EverCrypt_HMAC_compute_sha1(dst,puVar12,0x14,dst,0x14);
        *(undefined4 *)(puVar3 + 0x10) = *(undefined4 *)(puVar12 + 0x10);
        uVar2 = *(undefined8 *)(local_50 + local_70 + 8);
        *(undefined8 *)puVar3 = *(undefined8 *)(local_50 + local_70);
        *(undefined8 *)(puVar3 + 8) = uVar2;
      }
      uVar8 = (ulong)local_44;
    }
    uVar4 = (undefined1)uVar8;
  }
  return (_Bool)uVar4;
}

Assistant:

static bool
instantiate_sha1(
  EverCrypt_DRBG_state_s *st,
  uint8_t *personalization_string,
  uint32_t personalization_string_len
)
{
  if (personalization_string_len > Hacl_HMAC_DRBG_max_personalization_string_length)
  {
    return false;
  }
  uint32_t entropy_input_len = Hacl_HMAC_DRBG_min_length(Spec_Hash_Definitions_SHA1);
  uint32_t nonce_len = Hacl_HMAC_DRBG_min_length(Spec_Hash_Definitions_SHA1) / 2U;
  uint32_t min_entropy = entropy_input_len + nonce_len;
  KRML_CHECK_SIZE(sizeof (uint8_t), min_entropy);
  uint8_t entropy[min_entropy];
  memset(entropy, 0U, min_entropy * sizeof (uint8_t));
  bool ok = Lib_RandomBuffer_System_randombytes(entropy, min_entropy);
  if (!ok)
  {
    return false;
  }
  uint8_t *entropy_input = entropy;
  uint8_t *nonce = entropy + entropy_input_len;
  EverCrypt_DRBG_state_s st_s = *st;
  KRML_CHECK_SIZE(sizeof (uint8_t), entropy_input_len + nonce_len + personalization_string_len);
  uint8_t seed_material[entropy_input_len + nonce_len + personalization_string_len];
  memset(seed_material,
    0U,
    (entropy_input_len + nonce_len + personalization_string_len) * sizeof (uint8_t));
  memcpy(seed_material, entropy_input, entropy_input_len * sizeof (uint8_t));
  memcpy(seed_material + entropy_input_len, nonce, nonce_len * sizeof (uint8_t));
  memcpy(seed_material + entropy_input_len + nonce_len,
    personalization_string,
    personalization_string_len * sizeof (uint8_t));
  Hacl_HMAC_DRBG_state scrut;
  if (st_s.tag == SHA1_s)
  {
    scrut = st_s.case_SHA1_s;
  }
  else
  {
    scrut = KRML_EABORT(Hacl_HMAC_DRBG_state, "unreachable (pattern matches are exhaustive in F*)");
  }
  uint8_t *k = scrut.k;
  uint8_t *v = scrut.v;
  uint32_t *ctr = scrut.reseed_counter;
  memset(k, 0U, 20U * sizeof (uint8_t));
  memset(v, 1U, 20U * sizeof (uint8_t));
  ctr[0U] = 1U;
  uint32_t input_len = 21U + entropy_input_len + nonce_len + personalization_string_len;
  KRML_CHECK_SIZE(sizeof (uint8_t), input_len);
  uint8_t input0[input_len];
  memset(input0, 0U, input_len * sizeof (uint8_t));
  uint8_t *k_ = input0;
  memcpy(k_, v, 20U * sizeof (uint8_t));
  if (entropy_input_len + nonce_len + personalization_string_len != 0U)
  {
    memcpy(input0 + 21U,
      seed_material,
      (entropy_input_len + nonce_len + personalization_string_len) * sizeof (uint8_t));
  }
  input0[20U] = 0U;
  EverCrypt_HMAC_compute_sha1(k_, k, 20U, input0, input_len);
  EverCrypt_HMAC_compute_sha1(v, k_, 20U, v, 20U);
  memcpy(k, k_, 20U * sizeof (uint8_t));
  if (entropy_input_len + nonce_len + personalization_string_len != 0U)
  {
    uint32_t input_len0 = 21U + entropy_input_len + nonce_len + personalization_string_len;
    KRML_CHECK_SIZE(sizeof (uint8_t), input_len0);
    uint8_t input[input_len0];
    memset(input, 0U, input_len0 * sizeof (uint8_t));
    uint8_t *k_0 = input;
    memcpy(k_0, v, 20U * sizeof (uint8_t));
    if (entropy_input_len + nonce_len + personalization_string_len != 0U)
    {
      memcpy(input + 21U,
        seed_material,
        (entropy_input_len + nonce_len + personalization_string_len) * sizeof (uint8_t));
    }
    input[20U] = 1U;
    EverCrypt_HMAC_compute_sha1(k_0, k, 20U, input, input_len0);
    EverCrypt_HMAC_compute_sha1(v, k_0, 20U, v, 20U);
    memcpy(k, k_0, 20U * sizeof (uint8_t));
  }
  return true;
}